

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O2

void __thiscall
EnumerationParse_GoodValueAfterError_Test::EnumerationParse_GoodValueAfterError_Test
          (EnumerationParse_GoodValueAfterError_Test *this)

{
  anon_unknown.dwarf_99607::EnumerationParse::EnumerationParse(&this->super_EnumerationParse);
  (this->super_EnumerationParse).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumerationParse_0019a508;
  return;
}

Assistant:

TEST_F (EnumerationParse, GoodValueAfterError) {
    opt<enumeration> enum_opt{
        "enumeration", values (literal{"a", static_cast<int> (enumeration::a), "a description"},
                               literal{"b", static_cast<int> (enumeration::b), "b description"},
                               literal{"c", static_cast<int> (enumeration::c), "c description"})};

    std::vector<std::string> argv{"progname", "--unknown", "--enumeration=a"};
    string_stream output;
    string_stream errors;
    bool ok = details::parse_command_line_options (std::begin (argv), std::end (argv), "overview",
                                                   output, errors);
    ASSERT_FALSE (ok);
    EXPECT_THAT (errors.str (), Not (HasSubstr (PSTORE_NATIVE_TEXT ("'a'"))));
}